

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_api_base.h
# Opt level: O0

void __thiscall
mp::VarArrayDef::VarArrayDef
          (VarArrayDef *this,initializer_list<double> lbs,initializer_list<double> ubs,
          initializer_list<mp::var::Type> tys,initializer_list<const_char_*> nms)

{
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<mp::var::Type> __l_01;
  initializer_list<const_char_*> __l_02;
  iterator ppcVar1;
  size_t in_RCX;
  long in_RDI;
  undefined8 in_R8;
  vector<const_char_*,_std::allocator<const_char_*>_> *in_stack_fffffffffffffe88;
  ArrayRef<double> *in_stack_fffffffffffffe90;
  ArrayRef<const_char_*> *this_00;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffea0;
  vector<const_char_*,_std::allocator<const_char_*>_> *this_01;
  allocator_type *in_stack_fffffffffffffeb8;
  allocator_type *__a;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffec0;
  vector<const_char_*,_std::allocator<const_char_*>_> *this_02;
  iterator in_stack_fffffffffffffec8;
  size_type in_stack_fffffffffffffed0;
  undefined1 *puVar2;
  vector<const_char_*,_std::allocator<const_char_*>_> local_f9 [2];
  allocator_type local_c9 [17];
  ArrayRef<const_char_*> local_b8;
  undefined8 uStack_90;
  vector<const_char_*,_std::allocator<const_char_*>_> local_40;
  size_t local_20;
  undefined8 uStack_18;
  
  local_20 = in_RCX;
  uStack_18 = in_R8;
  std::allocator<double>::allocator((allocator<double> *)0x1349bd);
  __l._M_len = in_stack_fffffffffffffed0;
  __l._M_array = in_stack_fffffffffffffec8;
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffec0,__l,in_stack_fffffffffffffeb8);
  this_02 = &local_40;
  ArrayRef<double>::ArrayRef
            (in_stack_fffffffffffffe90,
             (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe88);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffea0);
  std::allocator<double>::~allocator((allocator<double> *)0x134a0f);
  ppcVar1 = (iterator)(in_RDI + 0x28);
  local_b8.size_ = local_20;
  uStack_90 = uStack_18;
  puVar2 = (undefined1 *)((long)&local_b8.data_ + 7);
  std::allocator<double>::allocator((allocator<double> *)0x134a3f);
  __l_00._M_len = (size_type)puVar2;
  __l_00._M_array = (iterator)ppcVar1;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)this_02,__l_00,in_stack_fffffffffffffeb8);
  ArrayRef<double>::ArrayRef
            (in_stack_fffffffffffffe90,
             (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe88);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffea0);
  std::allocator<double>::~allocator((allocator<double> *)0x134a91);
  __a = local_c9;
  std::allocator<mp::var::Type>::allocator((allocator<mp::var::Type> *)0x134ac1);
  __l_01._M_len = (size_type)puVar2;
  __l_01._M_array = (iterator)ppcVar1;
  std::vector<mp::var::Type,_std::allocator<mp::var::Type>_>::vector
            ((vector<mp::var::Type,_std::allocator<mp::var::Type>_> *)this_02,__l_01,__a);
  this_00 = &local_b8;
  ArrayRef<mp::var::Type>::ArrayRef
            ((ArrayRef<mp::var::Type> *)this_00,
             (vector<mp::var::Type,_std::allocator<mp::var::Type>_> *)in_stack_fffffffffffffe88);
  std::vector<mp::var::Type,_std::allocator<mp::var::Type>_>::~vector
            ((vector<mp::var::Type,_std::allocator<mp::var::Type>_> *)in_stack_fffffffffffffea0);
  std::allocator<mp::var::Type>::~allocator((allocator<mp::var::Type> *)0x134b13);
  this_01 = local_f9;
  std::allocator<const_char_*>::allocator((allocator<const_char_*> *)0x134b40);
  __l_02._M_len = (size_type)puVar2;
  __l_02._M_array = ppcVar1;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            (this_02,__l_02,(allocator_type *)__a);
  ArrayRef<const_char_*>::ArrayRef(this_00,in_stack_fffffffffffffe88);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector(this_01);
  std::allocator<const_char_*>::~allocator((allocator<const_char_*> *)0x134b8d);
  return;
}

Assistant:

VarArrayDef(std::initializer_list<double> lbs,
              std::initializer_list<double> ubs,
              std::initializer_list<var::Type> tys,
              std::initializer_list<const char*> nms = {}) :
    lbs_((lbs)), ubs_((ubs)), types_((tys)), names_(nms) { }